

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

bool __thiscall Clasp::Solver::split(Solver *this,LitVec *out)

{
  uint32 *puVar1;
  ExtendedStats *pEVar2;
  bool bVar3;
  Literal local_1c;
  
  bVar3 = splittable(this);
  if (bVar3) {
    copyGuidingPath(this,out);
    pushRootLevel(this,1);
    local_1c.rep_ =
         *(uint *)((long)&((this->assign_).trail.ebo_.buf)->rep_ +
                  (ulong)(uint)(*(int *)((this->levels_).super_type.ebo_.buf +
                                        ((this->levels_).root - 1)) << 2)) & 0xfffffffe ^ 2;
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back(out,&local_1c);
    this->splitReq_ = false;
    pEVar2 = (this->stats).extra;
    if (pEVar2 != (ExtendedStats *)0x0) {
      puVar1 = &pEVar2->splits;
      *puVar1 = *puVar1 + 1;
    }
  }
  return bVar3;
}

Assistant:

bool Solver::split(LitVec& out) {
	if (!splittable()) { return false; }
	copyGuidingPath(out);
	pushRootLevel();
	out.push_back(~decision(rootLevel()));
	splitReq_ = false;
	stats.addSplit();
	return true;
}